

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsluv.c
# Opt level: O0

void rgb2xyz(Triplet *in_out)

{
  double *in_RDI;
  double dVar1;
  double dVar2;
  double dVar3;
  double z;
  double y;
  double x;
  Triplet rgbl;
  double in_stack_ffffffffffffffc8;
  Triplet local_20;
  double *local_8;
  
  local_8 = in_RDI;
  local_20.a = to_linear(in_stack_ffffffffffffffc8);
  local_20.b = to_linear(in_stack_ffffffffffffffc8);
  local_20.c = to_linear(in_stack_ffffffffffffffc8);
  dVar1 = dot_product(m_inv,&local_20);
  dVar2 = dot_product(m_inv + 1,&local_20);
  dVar3 = dot_product(m_inv + 2,&local_20);
  *local_8 = dVar1;
  local_8[1] = dVar2;
  local_8[2] = dVar3;
  return;
}

Assistant:

static void
rgb2xyz(Triplet* in_out)
{
    Triplet rgbl = { to_linear(in_out->a), to_linear(in_out->b), to_linear(in_out->c) };
    double x = dot_product(&m_inv[0], &rgbl);
    double y = dot_product(&m_inv[1], &rgbl);
    double z = dot_product(&m_inv[2], &rgbl);
    in_out->a = x;
    in_out->b = y;
    in_out->c = z;
}